

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O2

void reader_init(FileReader *reader,char *file_in,MppCodingType type)

{
  FILE *__stream;
  undefined8 *reader_00;
  long lVar1;
  char *pcVar2;
  undefined8 uVar3;
  uint uVar4;
  uint local_2c;
  
  __stream = fopen(file_in,"rb");
  if (__stream == (FILE *)0x0) {
    reader_00 = (undefined8 *)0x0;
    _mpp_log_l(2,"mpi_dec_utils","failed to open input file %s\n",0,file_in);
    goto LAB_0010a92d;
  }
  reader_00 = (undefined8 *)mpp_osal_calloc("reader_init");
  if (reader_00 == (undefined8 *)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl","reader_init",0x14a);
    if ((DAT_00118343 & 0x10) != 0) goto LAB_0010a9c9;
  }
  *reader_00 = __stream;
  fseek(__stream,0,2);
  lVar1 = ftell(__stream);
  reader_00[1] = lVar1;
  fseek(__stream,0,0);
  pcVar2 = strstr(file_in,".ivf");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strstr(file_in,".jpg");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(file_in,".jpeg");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(file_in,".mjpeg");
        if ((type != MPP_VIDEO_CodingMJPEG) && (pcVar2 == (char *)0x0)) {
          local_2c = 0;
          mpp_env_get_u32("reader_buf_size",&local_2c,0x1000);
          uVar4 = 0x1000;
          if (0x1000 < local_2c) {
            uVar4 = local_2c;
          }
          *(undefined4 *)((long)reader_00 + 0x14) = 0;
          reader_00[4] = (ulong)(uVar4 + 0xfff & 0xfffff000);
          reader_00[5] = 0x100;
          *(undefined4 *)(reader_00 + 6) = 0;
          reader_00[7] = read_normal_file;
          *(undefined4 *)((long)reader_00 + 100) = 0x400;
          goto LAB_0010a90d;
        }
      }
    }
    *(undefined4 *)((long)reader_00 + 0x14) = 1;
    reader_00[4] = reader_00[1];
    reader_00[5] = 0;
    *(undefined4 *)(reader_00 + 6) = 0;
    reader_00[7] = read_jpeg_file;
    *(undefined4 *)((long)reader_00 + 100) = 1;
    mpp_buffer_group_get(reader_00 + 10,1,0,"mpi_dec_utils","check_file_type");
    if (reader_00[10] == 0) {
      _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl->group",
                 "check_file_type",0xe1);
      if ((DAT_00118343 & 0x10) != 0) {
LAB_0010a9c9:
        abort();
      }
    }
  }
  else {
    *(undefined4 *)((long)reader_00 + 0x14) = 2;
    reader_00[4] = 0;
    reader_00[5] = 0;
    *(undefined4 *)(reader_00 + 6) = 0x20;
    reader_00[7] = read_ivf_file;
    *(undefined4 *)((long)reader_00 + 100) = 0x400;
    fseek((FILE *)*reader_00,0x20,0);
    reader_00[8] = (long)*(int *)(reader_00 + 6);
  }
LAB_0010a90d:
  uVar3 = mpp_osal_calloc("reader_init",(ulong)*(uint *)((long)reader_00 + 100) << 3);
  reader_00[0xe] = uVar3;
  reader_start(reader_00);
LAB_0010a92d:
  *reader = reader_00;
  return;
}

Assistant:

void reader_init(FileReader* reader, char* file_in, MppCodingType type)
{
    FILE *fp_input = fopen(file_in, "rb");
    FileReaderImpl *impl = NULL;

    if (!fp_input) {
        mpp_err("failed to open input file %s\n", file_in);
        *reader = NULL;
        return;
    }

    impl = mpp_calloc(FileReaderImpl, 1);
    mpp_assert(impl);

    impl->fp_input = fp_input;
    fseek(fp_input, 0L, SEEK_END);
    impl->file_size = ftell(fp_input);
    fseek(fp_input, 0L, SEEK_SET);

    check_file_type(impl, file_in, type);

    impl->slots = mpp_calloc(FileBufSlot*, impl->slot_max);

    reader_start(impl);

    *reader = impl;
}